

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::emitShape(SemanticParser *this,SP *shape)

{
  bool bVar1;
  mapped_type_conflict *pmVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_RSI;
  element_type *in_RDI;
  SP SVar4;
  SP *in_stack_00000020;
  SemanticParser *in_stack_00000028;
  SP *in_stack_00000090;
  SemanticParser *in_stack_00000098;
  SP *in_stack_00000160;
  SemanticParser *in_stack_00000168;
  SP *in_stack_00000280;
  SemanticParser *in_stack_00000288;
  SP *in_stack_00000350;
  SemanticParser *in_stack_00000358;
  shared_ptr<pbrt::syntactic::Shape> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  shared_ptr<pbrt::syntactic::Shape> local_78 [7];
  
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a212b);
  bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  if (bVar1) {
    std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
              ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    emitPlyMesh(in_stack_00000168,in_stack_00000160);
    std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Shape> *)0x1a217e);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a21b3);
    bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    if (bVar1) {
      std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
                ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38);
      emitTriangleMesh(in_stack_00000288,in_stack_00000280);
      std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
                ((shared_ptr<pbrt::syntactic::Shape> *)0x1a2206);
      _Var3._M_pi = extraout_RDX_00;
    }
    else {
      std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a223b);
      bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      if (bVar1) {
        std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
                  ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
        emitCurve(in_stack_00000358,in_stack_00000350);
        std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
                  ((shared_ptr<pbrt::syntactic::Shape> *)0x1a2288);
        _Var3._M_pi = extraout_RDX_01;
      }
      else {
        std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a22ba);
        bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
        if (bVar1) {
          std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
                    ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff38);
          emitSphere(in_stack_00000028,in_stack_00000020);
          std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
                    ((shared_ptr<pbrt::syntactic::Shape> *)0x1a2307);
          _Var3._M_pi = extraout_RDX_02;
        }
        else {
          std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a2339);
          bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
          if (bVar1) {
            std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr(local_78,in_stack_ffffffffffffff38);
            emitDisk(in_stack_00000098,in_stack_00000090);
            std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
                      ((shared_ptr<pbrt::syntactic::Shape> *)0x1a2386);
            _Var3._M_pi = extraout_RDX_03;
          }
          else {
            std::
            __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a23c1);
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     ::operator[](in_RSI,(key_type *)in_RDI);
            *pmVar2 = *pmVar2 + 1;
            std::shared_ptr<pbrt::Shape>::shared_ptr((shared_ptr<pbrt::Shape> *)0x1a23e5);
            _Var3._M_pi = extraout_RDX_04;
          }
        }
      }
    }
  }
  SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitShape(pbrt::syntactic::Shape::SP shape)
  {
    if (shape->type == "plymesh") 
      return emitPlyMesh(shape);
    if (shape->type == "trianglemesh")
      return emitTriangleMesh(shape);
    if (shape->type == "curve")
      return emitCurve(shape);
    if (shape->type == "sphere")
      return emitSphere(shape);
    if (shape->type == "disk")
      return emitDisk(shape);

    // throw std::runtime_error("un-handled shape "+shape->type);
    unhandledShapeTypeCounter[shape->type]++;
    // std::cout << "WARNING: un-handled shape " << shape->type << std::endl;
    return Shape::SP();
  }